

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausInductiveClauses(Clu_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  sat_solver *psVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  char *__s;
  long lVar12;
  int iVar13;
  
  p->fFail = 0;
  if (p->pSatMain != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatMain);
  }
  iVar13 = 0;
  psVar7 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,p->nFrames + 1,0);
  p->pSatMain = psVar7;
  if (psVar7 != (sat_solver *)0x0) {
    Fra_ClausSimInfoClean(p);
    pVVar8 = p->vLitsProven;
    iVar6 = p->pCnf->nVars * 2;
    piVar2 = pVVar8->pArray;
    for (; iVar5 = p->nFrames, iVar13 < iVar5; iVar13 = iVar13 + 1) {
      iVar11 = 0;
      iVar5 = 0;
      while (iVar11 < p->vClausesProven->nSize) {
        iVar3 = Vec_IntEntry(p->vClausesProven,iVar11);
        if (p->nLutSize < iVar3 - iVar5) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x47c,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
        }
        iVar4 = sat_solver_addclause(p->pSatMain,piVar2 + iVar5,piVar2 + iVar3);
        iVar11 = iVar11 + 1;
        iVar5 = iVar3;
        if (iVar4 == 0) goto LAB_0052c765;
      }
      pVVar8 = p->vLitsProven;
      for (lVar10 = 0; lVar10 < pVVar8->nSize; lVar10 = lVar10 + 1) {
        pVVar8->pArray[lVar10] = pVVar8->pArray[lVar10] + iVar6;
      }
    }
    for (lVar10 = 0; lVar10 < pVVar8->nSize; lVar10 = lVar10 + 1) {
      pVVar8->pArray[lVar10] = pVVar8->pArray[lVar10] - iVar5 * iVar6;
    }
    iVar13 = p->pCnf->nVars * 2;
    piVar2 = p->vLits->pArray;
    for (iVar6 = 0; iVar6 < p->nFrames; iVar6 = iVar6 + 1) {
      iVar5 = 0;
      for (iVar11 = 0; iVar11 < p->vClauses->nSize; iVar11 = iVar11 + 1) {
        iVar3 = Vec_IntEntry(p->vClauses,iVar11);
        iVar4 = Vec_IntEntry(p->vCosts,iVar11);
        if (iVar4 != -1) {
          iVar4 = Vec_IntEntry(p->vCosts,iVar11);
          if (iVar4 < 1) {
            __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                          ,0x4af,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          if (p->nLutSize < iVar3 - iVar5) {
            __assert_fail("End - Beg <= p->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                          ,0x4b0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          iVar5 = sat_solver_addclause(p->pSatMain,piVar2 + iVar5,piVar2 + iVar3);
          if (iVar5 == 0) goto LAB_0052c765;
        }
        iVar5 = iVar3;
      }
      pVVar8 = p->vLits;
      for (lVar10 = 0; lVar10 < pVVar8->nSize; lVar10 = lVar10 + 1) {
        piVar1 = pVVar8->pArray + lVar10;
        *piVar1 = *piVar1 + iVar13;
      }
    }
    psVar7 = p->pSatMain;
    if (psVar7->qtail != psVar7->qhead) {
      iVar6 = sat_solver_simplify(psVar7);
      if (iVar6 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4c3,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4c4,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    if (p->fTarget != 0) {
      iVar6 = Fra_ClausRunSat0(p);
      if (iVar6 == 0) {
        if (p->fVerbose != 0) {
          printf(" Property fails.  ");
        }
        p->fFail = 1;
      }
      else if (p->fVerbose != 0) {
        printf(" Property holds.  ");
      }
    }
    psVar7 = p->pSatMain;
    if (psVar7->qtail != psVar7->qhead) {
      iVar6 = sat_solver_simplify(psVar7);
      if (iVar6 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4f0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4f1,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    iVar5 = 0;
    iVar11 = 0;
    iVar6 = 0;
    do {
      if (p->vClauses->nSize <= iVar11) {
        iVar6 = p->nFrames;
        pVVar8 = p->vLits;
        for (lVar10 = 0; lVar10 < pVVar8->nSize; lVar10 = lVar10 + 1) {
          piVar2 = pVVar8->pArray + lVar10;
          *piVar2 = *piVar2 - iVar13 * iVar6;
        }
        return iVar5;
      }
      iVar3 = Vec_IntEntry(p->vClauses,iVar11);
      iVar4 = Vec_IntEntry(p->vCosts,iVar11);
      if (iVar4 != -1) {
        iVar4 = Vec_IntEntry(p->vCosts,iVar11);
        if (iVar4 < 1) {
          __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x4ff,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
        }
        if (p->nLutSize < iVar3 - iVar6) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x500,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
        }
        lVar10 = (long)iVar6;
        iVar4 = Fra_ClausSimInfoCheck(p,piVar2 + lVar10,iVar3 - iVar6);
        iVar6 = extraout_EDX;
        if (iVar4 == 0) {
          lVar12 = (long)iVar3;
          for (lVar9 = lVar10; lVar9 < lVar12; lVar9 = lVar9 + 1) {
            *(byte *)(piVar2 + lVar9) = *(byte *)(piVar2 + lVar9) ^ 1;
          }
          iVar6 = sat_solver_solve(p->pSatMain,piVar2 + lVar10,piVar2 + lVar12,(long)p->nBTLimit,0,0
                                   ,0);
          for (; lVar10 < lVar12; lVar10 = lVar10 + 1) {
            *(byte *)(piVar2 + lVar10) = *(byte *)(piVar2 + lVar10) ^ 1;
          }
          psVar7 = p->pSatMain;
          if (iVar6 == -1) {
            if (psVar7->qtail != psVar7->qhead) {
              iVar6 = sat_solver_simplify(psVar7);
              if (iVar6 == 0) {
                __assert_fail("RetValue != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                              ,0x539,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
              if (p->pSatMain->qtail != p->pSatMain->qhead) {
                __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                              ,0x53a,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
            }
            goto LAB_0052c91f;
          }
          Fra_ClausSimInfoRecord(p,psVar7->model + (long)p->pCnf->nVars * (long)p->nFrames);
          iVar6 = extraout_EDX_00;
        }
        Vec_IntWriteEntry(p->vCosts,iVar11,iVar6);
        iVar5 = iVar5 + 1;
      }
LAB_0052c91f:
      iVar11 = iVar11 + 1;
      iVar6 = iVar3;
    } while( true );
  }
  __s = "Error: Main solver is unsat.";
LAB_0052c76c:
  puts(__s);
  return -1;
LAB_0052c765:
  __s = "Error: Solver is UNSAT after adding assumption clauses.";
  goto LAB_0052c76c;
}

Assistant:

int Fra_ClausInductiveClauses( Clu_Man_t * p )
{
//    Aig_Obj_t * pObjLi, * pObjLo;
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f, fFlag;//, Lits[2];
    p->fFail = 0;

    // reset the solver
    if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
    p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nFrames+1, 0 );
    if ( p->pSatMain == NULL )
    {
        printf( "Error: Main solver is unsat.\n" );
        return -1;
    }  
    Fra_ClausSimInfoClean( p );

/*
    // check if the property holds
    if ( Fra_ClausRunSat0( p ) )
        printf( "Property holds without strengthening.\n" );
    else
        printf( "Property does not hold without strengthening.\n" );
*/
/*
    // add constant registers
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )  
        if ( Aig_ObjFanin0(pObjLi) == Aig_ManConst1(p->pAig) )
        {
            for ( k = 0; k < p->nFrames; k++ )
            {
                Lits[0] = k * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObjLo->Id], Aig_ObjFaninC0(pObjLi) ); 
                RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
                if ( RetValue == 0 )
                {
                    printf( "Error: Solver is UNSAT after adding constant-register clauses.\n" );
                    return -1;
                }
            }
        }
*/


    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClausesProven, End, i )
        {
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
            p->vLitsProven->pArray[i] += nLitsTot;
    }
    // return clauses back to normal
    nLitsTot = (p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
        p->vLitsProven->pArray[i] -= nLitsTot;

/*
    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    Beg = 0;
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        assert( End - Beg <= p->nLutSize );
        // add the clause to all timeframes
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
            return -1;
        }
        Beg = End;
    }
*/
    
    // add the clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }
  
    // check if the property holds
    if ( p->fTarget )
    {
        if ( Fra_ClausRunSat0( p ) )
        {
            if ( p->fVerbose )
            printf( " Property holds.  " );
        }
        else
        {
            if ( p->fVerbose )
            printf( " Property fails.  " );
    //        return -2;
            p->fFail = 1;
        }
    }

/*
    // add the property for the first K frames
    for ( i = 0; i < p->nFrames; i++ )
    {
        Aig_Obj_t * pObj;
        int Lits[2];
        // set the output literals
        pObj = Aig_ManCo(p->pAig, 0);
        Lits[0] = i * nLitsTot + toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding property for the first K frames.\n" );
            return -1;
        }
    }
*/

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }


    // check the clause in the last timeframe
    Beg = 0;
    Counter = 0;
    Vec_IntForEachEntry( p->vClauses, End, i )
    {
        if ( Vec_IntEntry( p->vCosts, i ) == -1 )
        {
            Beg = End;
            continue;
        }
        assert( Vec_IntEntry( p->vCosts, i ) > 0 );
        assert( End - Beg <= p->nLutSize );

        if ( Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg) )
        {
            fFlag = 1;
//            printf( "s-" );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
        else
        {
            fFlag = 0;
//            printf( "s?" );
        }

        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );
        RetValue = sat_solver_solve( p->pSatMain, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );

        // the problem is not solved
        if ( RetValue != l_False )
        {
//            printf( "S- " );
//            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model.ptr + p->nFrames * p->pCnf->nVars );
            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model + p->nFrames * p->pCnf->nVars );
//            RetValue = Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg);
//            assert( RetValue );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
//        printf( "S+ " );
//        assert( !fFlag );

/*
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding proved clauses.\n" );
            return -1;
        }
*/
        Beg = End;

        // simplify the solver
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // return clauses back to normal
    nLitsTot = p->nFrames * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;

//    if ( fFail )
//        return -2;
    return Counter;
}